

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O1

ssize_t __thiscall Uic::write(Uic *this,int __fd,void *__buf,size_t __n)

{
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> QVar1;
  int iVar2;
  DomUI *other;
  ulong uVar3;
  size_t sVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char16_t *__n_00;
  char16_t *__buf_00;
  void *__buf_01;
  QArrayData **ppQVar5;
  QArrayData *pQVar6;
  long in_FS_OFFSET;
  double dVar7;
  QLatin1String QVar8;
  QXmlStreamReader reader;
  QArrayData *local_48;
  char16_t *local_40;
  long local_38;
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (DomUI *)0x0;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_48);
  QXmlStreamReader::setDevice((QIODevice *)&local_48);
  other = parseUiFile((QXmlStreamReader *)&local_48);
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::reset(&local_30,other);
  QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_48);
  if (local_30.d != (DomUI *)0x0) {
    local_48 = &(((local_30.d)->m_attr_version).d.d)->super_QArrayData;
    local_40 = ((local_30.d)->m_attr_version).d.ptr;
    local_38 = ((local_30.d)->m_attr_version).d.size;
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ppQVar5 = &local_48;
    __buf_01 = (void *)0x0;
    dVar7 = (double)QString::toDouble((bool *)ppQVar5);
    iVar2 = (int)ppQVar5;
    sVar4 = extraout_RDX;
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        __buf_01 = (void *)0x2;
        pQVar6 = local_48;
        QArrayData::deallocate(local_48,2,0x10);
        iVar2 = (int)pQVar6;
        sVar4 = extraout_RDX_00;
      }
    }
    if (4.0 <= dVar7) {
      local_48 = &(((local_30.d)->m_attr_language).d.d)->super_QArrayData;
      __buf_00 = ((local_30.d)->m_attr_language).d.ptr;
      local_38 = ((local_30.d)->m_attr_language).d.size;
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      sVar4 = CONCAT71((int7)((ulong)local_30.d >> 8),(local_30.d)->m_attr_idbasedtr);
      this->drv->m_idBasedTranslations = (local_30.d)->m_attr_idbasedtr;
      local_40 = __buf_00;
      if (local_38 == 0) {
LAB_0017770f:
        uVar3 = write(this,(int)local_30.d,__buf_00,sVar4);
        uVar3 = uVar3 & 0xffffffff;
      }
      else {
        sVar4 = 0;
        QVar8.m_data = (char *)0x3;
        QVar8.m_size = (qsizetype)&local_48;
        iVar2 = QString::compare(QVar8,0x18147a);
        __buf_00 = __n_00;
        if (iVar2 == 0) goto LAB_0017770f;
        write((int)&local_40,&local_38,(size_t)__n_00);
        uVar3 = 0;
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
      goto LAB_0017774a;
    }
    write(iVar2,__buf_01,sVar4);
  }
  uVar3 = 0;
LAB_0017774a:
  QVar1.d = local_30.d;
  if (local_30.d != (DomUI *)0x0) {
    DomUI::~DomUI(local_30.d);
    operator_delete(QVar1.d,0x148);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Uic::write(QIODevice *in)
{
    QScopedPointer<DomUI> ui;
    {
        QXmlStreamReader reader;
        reader.setDevice(in);
        ui.reset(parseUiFile(reader));
    }

    if (ui.isNull())
        return false;

    double version = ui->attributeVersion().toDouble();
    if (version < 4.0) {
        fprintf(stderr, "uic: File generated with too old version of Qt Widgets Designer\n");
        return false;
    }

    const QString &language = ui->attributeLanguage();
    driver()->setUseIdBasedTranslations(ui->attributeIdbasedtr());

    if (!language.isEmpty() && language.compare("c++"_L1, Qt::CaseInsensitive) != 0) {
        fprintf(stderr, "uic: File is not a \"c++\" ui file, language=%s\n", qPrintable(language));
        return false;
    }

    return write(ui.data());
}